

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O2

BOOL __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::IsFreeObject
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,void *objectAddress)

{
  char *pcVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  
  pcVar1 = (this->super_HeapBlock).address;
  uVar4 = 0;
  if (objectAddress < pcVar1 + 0x8000 && pcVar1 <= objectAddress) {
    uVar3 = GetAddressIndex(this,objectAddress);
    uVar4 = 0;
    if (uVar3 != 0xffff) {
      uVar3 = GetAddressBitIndex(objectAddress);
      bVar2 = BVStatic<2048UL>::Test(&this->debugFreeBits,(uint)uVar3);
      uVar4 = (uint)bVar2;
    }
  }
  return uVar4;
}

Assistant:

BOOL
SmallHeapBlockT<TBlockAttributes>::IsFreeObject(void * objectAddress)
{
    if (objectAddress < this->GetAddress() || objectAddress >= this->GetEndAddress())
    {
        return false;
    }
    ushort index = GetAddressIndex(objectAddress);
    if (index == SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit)
    {
        return false;
    }

    return this->GetDebugFreeBitVector()->Test(GetAddressBitIndex(objectAddress));
}